

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O3

Arguments * __thiscall
inja::Renderer::get_argument_vector<true>
          (Arguments *__return_storage_ptr__,Renderer *this,FunctionNode *node)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  _Map_pointer pppbVar4;
  DataNode *node_00;
  pointer pcVar5;
  bool bVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  _Elt_pointer ppbVar10;
  _Elt_pointer ppDVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  size_type *psVar15;
  char cVar16;
  ulong __val;
  shared_ptr<inja::ExpressionNode> *a;
  pointer psVar17;
  ulong uVar18;
  long lVar19;
  Arguments *result;
  string __str_1;
  string __str;
  string local_e8;
  Arguments *local_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  FunctionNode *local_80;
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  stack<const_inja::DataNode_*,_std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>_>
  *local_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  psVar1 = (node->arguments).
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (node->arguments).
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __val = (long)psVar2 - (long)psVar1 >> 4;
  local_80 = node;
  for (psVar17 = psVar1; local_c8 = __return_storage_ptr__, psVar2 != psVar17; psVar17 = psVar17 + 1
      ) {
    peVar3 = (psVar17->super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(peVar3->super_AstNode)._vptr_AstNode)(peVar3,this);
    __return_storage_ptr__ = local_c8;
  }
  pppbVar4 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (__val <= ((long)(this->data_eval_stack).c.
                      super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->data_eval_stack).c.
                      super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this->data_eval_stack).c.
                      super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->data_eval_stack).c.
                      super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)pppbVar4 -
                         (long)(this->data_eval_stack).c.
                               super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(pppbVar4 == (_Map_pointer)0x0)) * 0x40) goto LAB_00156fb1;
  cVar16 = '\x01';
  if (9 < __val) {
    uVar18 = __val;
    cVar7 = '\x04';
    do {
      cVar16 = cVar7;
      if (uVar18 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_00156cb4;
      }
      if (uVar18 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_00156cb4;
      }
      if (uVar18 < 10000) goto LAB_00156cb4;
      bVar6 = 99999 < uVar18;
      uVar18 = uVar18 / 10000;
      cVar7 = cVar16 + '\x04';
    } while (bVar6);
    cVar16 = cVar16 + '\x01';
  }
LAB_00156cb4:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val);
  plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x182bd1);
  local_a0 = &local_90;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_90 = *plVar12;
    lStack_88 = plVar8[3];
  }
  else {
    local_90 = *plVar12;
    local_a0 = (long *)*plVar8;
  }
  local_98 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_a0);
  local_c0 = &local_b0;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_b0 = *puVar13;
    lStack_a8 = plVar8[3];
  }
  else {
    local_b0 = *puVar13;
    local_c0 = (ulong *)*plVar8;
  }
  local_b8 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pppbVar4 = (this->data_eval_stack).c.
             super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar18 = ((long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->data_eval_stack).c.
                  super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppbVar4 -
                     (long)(this->data_eval_stack).c.
                           super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(pppbVar4 == (_Map_pointer)0x0)) * 0x40;
  cVar16 = '\x01';
  if (9 < uVar18) {
    uVar14 = uVar18;
    cVar7 = '\x04';
    do {
      cVar16 = cVar7;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_00156e3c;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_00156e3c;
      }
      if (uVar14 < 10000) goto LAB_00156e3c;
      bVar6 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar7 = cVar16 + '\x04';
    } while (bVar6);
    cVar16 = cVar16 + '\x01';
  }
LAB_00156e3c:
  local_78 = local_68;
  ::std::__cxx11::string::_M_construct((ulong)&local_78,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,uVar18);
  uVar18 = CONCAT44(uStack_6c,local_70) + local_b8;
  uVar14 = 0xf;
  if (local_c0 != &local_b0) {
    uVar14 = local_b0;
  }
  if (uVar14 < uVar18) {
    uVar14 = 0xf;
    if (local_78 != local_68) {
      uVar14 = local_68[0];
    }
    if (uVar14 < uVar18) goto LAB_00156eaf;
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_00156eaf:
    puVar9 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_78);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  psVar15 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_e8.field_2._M_allocated_capacity = *psVar15;
    local_e8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar15;
    local_e8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_e8._M_string_length = puVar9[1];
  *puVar9 = psVar15;
  puVar9[1] = 0;
  *(undefined1 *)psVar15 = 0;
  throw_renderer_error(this,&local_e8,(AstNode *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  __return_storage_ptr__ = local_c8;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
LAB_00156fb1:
  std::
  vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
  ::vector(__return_storage_ptr__,__val,(allocator_type *)&local_e8);
  if (psVar1 != psVar2) {
    local_80 = (FunctionNode *)&this->data_eval_stack;
    local_58 = &this->not_found_stack;
    lVar19 = __val + (__val == 0);
    do {
      __val = __val - 1;
      ppbVar10 = (this->data_eval_stack).c.
                 super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppbVar10 ==
          (this->data_eval_stack).c.
          super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppbVar10 = (this->data_eval_stack).c.
                   super__Deque_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      (__return_storage_ptr__->
      super__Vector_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
      )._M_impl.super__Vector_impl_data._M_start[__val] = ppbVar10[-1];
      std::
      deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
      ::pop_back((deque<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  *)local_80);
      if ((__return_storage_ptr__->
          super__Vector_base<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
          )._M_impl.super__Vector_impl_data._M_start[__val] ==
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)0x0) {
        ppDVar11 = (this->not_found_stack).c.
                   super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppDVar11 ==
            (this->not_found_stack).c.
            super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppDVar11 = (this->not_found_stack).c.
                     super__Deque_base<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        node_00 = ppDVar11[-1];
        std::deque<const_inja::DataNode_*,_std::allocator<const_inja::DataNode_*>_>::pop_back
                  (&local_58->c);
        local_a0 = &local_90;
        pcVar5 = (node_00->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar5,pcVar5 + (node_00->name)._M_string_length);
        plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x182c01);
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_b0 = *puVar13;
          lStack_a8 = plVar8[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *puVar13;
          local_c0 = (ulong *)*plVar8;
        }
        local_b8 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c0);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar15 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e8.field_2._M_allocated_capacity = *psVar15;
          local_e8.field_2._8_8_ = puVar9[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar15;
          local_e8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_e8._M_string_length = puVar9[1];
        *puVar9 = psVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        throw_renderer_error(this,&local_e8,(AstNode *)node_00);
        __return_storage_ptr__ = local_c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
      }
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Arguments get_argument_vector(const FunctionNode& node) {
    const size_t N = node.arguments.size();
    for (const auto& a : node.arguments) {
      a->accept(*this);
    }

    if (data_eval_stack.size() < N) {
      throw_renderer_error("function needs " + std::to_string(N) + " variables, but has only found " + std::to_string(data_eval_stack.size()), node);
    }

    Arguments result {N};
    for (size_t i = 0; i < N; i += 1) {
      result[N - i - 1] = data_eval_stack.top();
      data_eval_stack.pop();

      if (!result[N - i - 1]) {
        const auto data_node = not_found_stack.top();
        not_found_stack.pop();

        if (throw_not_found) {
          throw_renderer_error("variable '" + static_cast<std::string>(data_node->name) + "' not found", *data_node);
        }
      }
    }
    return result;
  }